

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

UniquePtr<SSL_CTX> __thiscall
bssl::anon_unknown_0::SSLVersionTest::CreateContext(SSLVersionTest *this)

{
  _Head_base<0UL,_ssl_ctx_st_*,_false> ctx_00;
  bool bVar1;
  int iVar2;
  SSL_METHOD *meth;
  SSL_CTX *ctx_01;
  ParamType *pPVar3;
  UniquePtr<SSL_CTX> ctx;
  _Head_base<0UL,_ssl_ctx_st_*,_false> local_18;
  
  bVar1 = is_dtls(this);
  if (bVar1) {
    meth = (SSL_METHOD *)DTLS_method();
  }
  else {
    meth = (SSL_METHOD *)TLS_method();
  }
  ctx_01 = (SSL_CTX *)SSL_CTX_new(meth);
  local_18._M_head_impl = ctx_01;
  if (ctx_01 != (SSL_CTX *)0x0) {
    pPVar3 = testing::WithParamInterface<bssl::(anonymous_namespace)::VersionParam>::GetParam();
    iVar2 = SSL_CTX_set_min_proto_version(ctx_01,pPVar3->version);
    ctx_00._M_head_impl = local_18._M_head_impl;
    if (iVar2 != 0) {
      pPVar3 = testing::WithParamInterface<bssl::(anonymous_namespace)::VersionParam>::GetParam();
      iVar2 = SSL_CTX_set_max_proto_version(ctx_00._M_head_impl,pPVar3->version);
      if (iVar2 != 0) {
        (this->super_TestWithParam<bssl::(anonymous_namespace)::VersionParam>).super_Test._vptr_Test
             = (_func_int **)local_18._M_head_impl;
        local_18._M_head_impl = (SSL_CTX *)0x0;
        goto LAB_00166366;
      }
    }
  }
  (this->super_TestWithParam<bssl::(anonymous_namespace)::VersionParam>).super_Test._vptr_Test =
       (_func_int **)0x0;
LAB_00166366:
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&local_18);
  return (__uniq_ptr_data<ssl_ctx_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<ssl_ctx_st,_bssl::internal::Deleter,_true,_true>)this;
}

Assistant:

bssl::UniquePtr<SSL_CTX> CreateContext() const {
    const SSL_METHOD *method = is_dtls() ? DTLS_method() : TLS_method();
    bssl::UniquePtr<SSL_CTX> ctx(SSL_CTX_new(method));
    if (!ctx || !SSL_CTX_set_min_proto_version(ctx.get(), version()) ||
        !SSL_CTX_set_max_proto_version(ctx.get(), version())) {
      return nullptr;
    }
    return ctx;
  }